

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  bool bVar1;
  ulong *in_RDX;
  SQObjectPtr val;
  SQTable *m;
  SQObjectPtr *key;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffff88;
  SQVM *in_stack_ffffffffffffff90;
  SQObjectPtr *val_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SQObjectPtr **in_stack_ffffffffffffffb0;
  SQObjectType in_stack_ffffffffffffffbc;
  SQObjectValue in_stack_ffffffffffffffc0;
  HSQUIRRELVM in_stack_ffffffffffffffc8;
  SQVM *local_8;
  
  bVar1 = sq_aux_gettypedarg(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0.nInteger,
                             in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  if (bVar1) {
    stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
    val_00 = (SQObjectPtr *)&stack0xffffffffffffffb8;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
    bVar1 = SQTable::Get((SQTable *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (SQObjectPtr *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),val_00);
    if (bVar1) {
      *in_RDX = (ulong)((in_stack_ffffffffffffffc0.nInteger & 0x400000U) == 0);
      in_RDX[1] = (ulong)((uint)in_stack_ffffffffffffffc0.fFloat & 0x3fffff);
      SQVM::Pop(in_stack_ffffffffffffff90);
      local_8 = (SQVM *)0x0;
    }
    else {
      in_stack_ffffffffffffff90 =
           (SQVM *)sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_8 = in_stack_ffffffffffffff90;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
  }
  else {
    local_8 = (SQVM *)0xffffffffffffffff;
  }
  return (SQRESULT)local_8;
}

Assistant:

SQRESULT sq_getmemberhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQTable *m = _class(*o)->_members;
    SQObjectPtr val;
    if(m->Get(key,val)) {
        handle->_static = _isfield(val) ? SQFalse : SQTrue;
        handle->_index = _member_idx(val);
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}